

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O1

int Io_WritePlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  void *__s_00;
  char *pcVar6;
  ProgressBar *p;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  undefined8 *puVar9;
  size_t __n;
  size_t __n_00;
  long lVar10;
  uint uVar11;
  Abc_Obj_t *pAVar12;
  long lVar13;
  
  pVVar7 = pNtk->vCos;
  iVar4 = pVVar7->nSize;
  if (iVar4 < 1) {
    uVar11 = 0;
  }
  else {
    lVar13 = 0;
    uVar11 = 0;
    do {
      pAVar12 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar7->pArray[lVar13] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar7->pArray[lVar13] + 0x20) * 8);
      if (pAVar12->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar12 = (Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray];
      }
      uVar5 = 1;
      if ((*(uint *)&pAVar12->field_0x14 & 0xf) == 7) {
        iVar4 = Abc_NodeIsConst(pAVar12);
        if (iVar4 == 0) {
          uVar5 = Abc_SopGetCubeNum((char *)(pAVar12->field_5).pData);
        }
        else {
          iVar4 = Abc_NodeIsConst1(pAVar12);
          uVar5 = (uint)(iVar4 != 0);
        }
      }
      uVar11 = uVar11 + uVar5;
      lVar13 = lVar13 + 1;
      pVVar7 = pNtk->vCos;
      iVar4 = pVVar7->nSize;
    } while (lVar13 < iVar4);
  }
  iVar2 = pNtk->vCis->nSize;
  __n = (size_t)iVar2;
  __s = malloc(__n + 1);
  __s_00 = malloc((long)(iVar4 + 1));
  memset(__s,0x2d,__n);
  *(undefined1 *)((long)__s + __n) = 0;
  __n_00 = (size_t)iVar4;
  memset(__s_00,0x30,__n_00);
  *(undefined1 *)((long)__s_00 + __n_00) = 0;
  fprintf((FILE *)pFile,".i %d\n",__n);
  fprintf((FILE *)pFile,".o %d\n",__n_00);
  fwrite(".ilb",4,1,(FILE *)pFile);
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*pVVar7->pArray[lVar13] + 0x20) + 8) +
                            (long)**(int **)((long)pVVar7->pArray[lVar13] + 0x30) * 8));
      fprintf((FILE *)pFile," %s",pcVar6);
      lVar13 = lVar13 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar13 < pVVar7->nSize);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".ob",3,1,(FILE *)pFile);
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*pVVar7->pArray[lVar13] + 0x20) + 8) +
                            (long)**(int **)((long)pVVar7->pArray[lVar13] + 0x20) * 8));
      fprintf((FILE *)pFile," %s",pcVar6);
      lVar13 = lVar13 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar13 < pVVar7->nSize);
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".p %d\n",(ulong)uVar11);
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      *(long *)((long)pVVar7->pArray[lVar13] + 0x40) = lVar13;
      lVar13 = lVar13 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar13 < pVVar7->nSize);
  }
  p = Extra_ProgressBarStart(_stdout,iVar4);
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      plVar3 = (long *)pVVar7->pArray[lVar13];
      if (lVar13 != 0) {
        *(undefined1 *)((long)__s_00 + lVar13 + -1) = 0x30;
      }
      *(undefined1 *)((long)__s_00 + lVar13) = 0x31;
      pAVar12 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
      if (pAVar12->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar12 = (Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray];
      }
      uVar11 = *(uint *)&pAVar12->field_0x14 & 0xf;
      if ((uVar11 == 2) || (uVar11 == 5)) {
        *(char *)((long)__s + (long)(pAVar12->field_6).iTemp) =
             (char)((*(int *)((long)plVar3 + 0x14) << 0x15) >> 0x1f) + '1';
        fprintf((FILE *)pFile,"%s %s\n",__s);
        *(undefined1 *)((long)__s + (long)(pAVar12->field_6).iTemp) = 0x2d;
      }
      else {
        if (uVar11 != 7) {
          __assert_fail("Abc_ObjIsCi(pDriver)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                        ,0x70,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
        }
        iVar4 = Abc_NodeIsConst(pAVar12);
        if (iVar4 == 0) {
          iVar4 = Abc_SopIsComplement((char *)(pAVar12->field_5).pData);
          if (iVar4 != 0) {
            __assert_fail("!Abc_SopIsComplement( (char *)pDriver->pData )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                          ,0x7e,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
          }
          pcVar6 = (char *)(pAVar12->field_5).pData;
          if (*pcVar6 != '\0') {
            lVar10 = (long)(pAVar12->vFanins).nSize + 3;
            do {
              if (0 < (pAVar12->vFanins).nSize) {
                lVar8 = 0;
                do {
                  puVar9 = (undefined8 *)
                           pAVar12->pNtk->vObjs->pArray[(pAVar12->vFanins).pArray[lVar8]];
                  if (*(int *)*puVar9 == 1) {
                    puVar9 = *(undefined8 **)
                              (*(long *)(*(long *)((int *)*puVar9 + 8) + 8) +
                              (long)*(int *)puVar9[4] * 8);
                  }
                  if (iVar2 <= (int)puVar9[8]) {
                    __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                                  ,0x87,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
                  }
                  *(char *)((long)__s + (long)(int)puVar9[8]) = pcVar6[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 < (pAVar12->vFanins).nSize);
              }
              fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
              pcVar1 = pcVar6 + lVar10;
              pcVar6 = pcVar6 + lVar10;
            } while (*pcVar1 != '\0');
          }
          if (0 < (pAVar12->vFanins).nSize) {
            lVar10 = 0;
            do {
              puVar9 = (undefined8 *)pAVar12->pNtk->vObjs->pArray[(pAVar12->vFanins).pArray[lVar10]]
              ;
              if (*(int *)*puVar9 == 1) {
                puVar9 = *(undefined8 **)
                          (*(long *)(*(long *)((int *)*puVar9 + 8) + 8) +
                          (long)*(int *)puVar9[4] * 8);
              }
              uVar11 = *(uint *)((long)puVar9 + 0x14) & 0xf;
              if ((uVar11 != 2) && (uVar11 != 5)) {
                __assert_fail("Abc_ObjIsCi(pFanin)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                              ,0x90,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
              }
              *(undefined1 *)((long)__s + (long)*(int *)(puVar9 + 8)) = 0x2d;
              lVar10 = lVar10 + 1;
            } while (lVar10 < (pAVar12->vFanins).nSize);
          }
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar13)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar13,(char *)0x0);
          }
        }
        else {
          iVar4 = Abc_NodeIsConst1(pAVar12);
          if (iVar4 != 0) {
            fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
          }
        }
      }
      lVar13 = lVar13 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar13 < pVVar7->nSize);
  }
  Extra_ProgressBarStop(p);
  fwrite(".e\n",3,1,(FILE *)pFile);
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      *(undefined8 *)((long)pVVar7->pArray[lVar13] + 0x40) = 0;
      lVar13 = lVar13 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar13 < pVVar7->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the network in PLA format.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Io_WritePlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCubeIn, * pCubeOut, * pCube;
    int i, k, nProducts, nInputs, nOutputs, nFanins;

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    // collect the parameters
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
    pCubeIn  = ABC_ALLOC( char, nInputs + 1 );
    pCubeOut = ABC_ALLOC( char, nOutputs + 1 );
    memset( pCubeIn,  '-', (size_t)nInputs );     pCubeIn[nInputs]   = 0;
    memset( pCubeOut, '0', (size_t)nOutputs );    pCubeOut[nOutputs] = 0;

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", nOutputs );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanout0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    Abc_NtkForEachCo( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nProducts );

    // mark the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    // write the cubes
    pProgress = Extra_ProgressBarStart( stdout, nOutputs );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // prepare the output cube
        if ( i - 1 >= 0 )
            pCubeOut[i-1] = '0';
        pCubeOut[i] = '1';

        // consider special cases of nodes
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            assert( Abc_ObjIsCi(pDriver) );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '1' - Abc_ObjFaninC0(pNode);
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '-';
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            continue;
        }

        // make sure the cover is not complemented
        assert( !Abc_SopIsComplement( (char *)pDriver->pData ) );

        // write the cubes
        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs );
                pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = pCube[k];
            }
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
        }
        // clean the cube for future writing
        Abc_ObjForEachFanin( pDriver, pFanin, k )
        {
            pFanin = Abc_ObjFanin0Ntk(pFanin);
            assert( Abc_ObjIsCi(pFanin) );
            pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = '-';
        }
        Extra_ProgressBarUpdate( pProgress, i, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    fprintf( pFile, ".e\n" );

    // clean the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;
    ABC_FREE( pCubeIn );
    ABC_FREE( pCubeOut );
    return 1;
}